

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cpp
# Opt level: O3

void __thiscall log_test_DefaultConstructor_Test::TestBody(log_test_DefaultConstructor_Test *this)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined8 uVar5;
  uint *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  AssertionResult gtest_ar;
  log_name_list_type log_name_list [10];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  AssertHelper local_f8;
  internal local_f0 [8];
  undefined8 *local_e8;
  AssertHelperData *local_e0;
  undefined8 local_d8;
  undefined8 local_d0 [5];
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  memcpy(&local_d8,&PTR_anon_var_dwarf_6b42_0014ebf0,0xa0);
  local_f8.data_ = (AssertHelperData *)log_map_create(0x200);
  local_100._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e0 = local_f8.data_;
  testing::internal::CmpHelperNE<log_map_type*,log_map_type*>
            (local_f0,"(log_map)__null","(log_map)map",(log_map_type **)&local_100,
             (log_map_type **)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x3e,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  lVar13 = 0;
  do {
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar2 = log_map_insert(local_e0,*(undefined8 *)((long)local_d0 + lVar13 + -8),
                           (long)local_d0 + lVar13);
    local_f8.data_._0_4_ = uVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_f0,"(int)0",
               "(int)log_map_insert(map, log_name_list[iterator].name, (const void *)&log_name_list[iterator].value)"
               ,(int *)&local_100,(int *)&local_f8);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if (local_e8 != (undefined8 *)0x0) {
        pcVar11 = (char *)*local_e8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0x42,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    puVar1 = local_e8;
    if (local_e8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_e8 != local_e8 + 2) {
        operator_delete((undefined8 *)*local_e8);
      }
      operator_delete(puVar1);
    }
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0xa0);
  local_100._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa;
  local_f8.data_ = (AssertHelperData *)log_map_size(local_e0);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_f0,"(size_t)log_name_list_size","(size_t)log_map_size(map)",
             (unsigned_long *)&local_100,(unsigned_long *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x45,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  lVar13 = 8;
  do {
    puVar4 = (undefined4 *)log_map_get(local_e0,*(undefined8 *)((long)&local_e0 + lVar13));
    local_100._M_head_impl._0_4_ = *(undefined4 *)((long)local_d0 + lVar13 + -8);
    local_f8.data_._0_4_ = *puVar4;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_f0,"(unsigned int)log_name_list[iterator].value","(unsigned int)value",
               (uint *)&local_100,(uint *)&local_f8);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if (local_e8 != (undefined8 *)0x0) {
        pcVar11 = (char *)*local_e8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0x4d,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    puVar1 = local_e8;
    if (local_e8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_e8 != local_e8 + 2) {
        operator_delete((undefined8 *)*local_e8);
      }
      operator_delete(puVar1);
    }
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0xa8);
  uVar5 = log_map_iterator_begin(local_e0);
  iVar3 = log_map_iterator_end(uVar5);
  if (iVar3 != 0) {
    do {
      pcVar11 = (char *)log_map_iterator_key(uVar5);
      puVar6 = (uint *)log_map_iterator_value(uVar5);
      local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
      iVar3 = strcmp((char *)local_d0[(ulong)*puVar6 * 2 + -1],pcVar11);
      local_f8.data_._0_4_ = iVar3;
      testing::internal::CmpHelperEQ<int,int>
                (local_f0,"(int)0","(int)strcmp(log_name_list[value].name, key)",(int *)&local_100,
                 (int *)&local_f8);
      if (local_f0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_100);
        pcVar11 = "";
        if (local_e8 != (undefined8 *)0x0) {
          pcVar11 = (char *)*local_e8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                   ,0x58,pcVar11);
        testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        if (local_100._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_100._M_head_impl + 8))();
        }
      }
      puVar1 = local_e8;
      if (local_e8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_e8 != local_e8 + 2) {
          operator_delete((undefined8 *)*local_e8);
        }
        operator_delete(puVar1);
      }
      log_map_iterator_next(uVar5);
      iVar3 = log_map_iterator_end(uVar5);
    } while (iVar3 != 0);
  }
  uVar2 = log_map_destroy(local_e0);
  local_100._M_head_impl._0_4_ = uVar2;
  local_f8.data_ = local_f8.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)log_map_destroy(map)","(int)0",(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x5b,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  lVar13 = 0;
  do {
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar2 = log_create(*(undefined8 *)((long)local_d0 + lVar13 + -8));
    local_f8.data_._0_4_ = uVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_f0,"(int)0","(int)log_create(log_name_list[iterator].name)",(int *)&local_100,
               (int *)&local_f8);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if (local_e8 != (undefined8 *)0x0) {
        pcVar11 = (char *)*local_e8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,100,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    puVar1 = local_e8;
    if (local_e8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_e8 != local_e8 + 2) {
        operator_delete((undefined8 *)*local_e8);
      }
      operator_delete(puVar1);
    }
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0xa0);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar5 = log_policy_format_text();
  uVar7 = log_policy_schedule_sync();
  uVar8 = log_policy_storage_sequential();
  uVar9 = log_policy_stream_stdio(_stdout);
  uVar2 = log_configure_impl(local_d8,4,uVar5,uVar7,uVar8,uVar9);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(log_name_list[0].name, 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x70,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar5 = log_policy_format_text();
  uVar7 = log_policy_schedule_sync();
  uVar8 = log_policy_storage_sequential();
  uVar9 = log_policy_stream_stdio(_stderr);
  uVar2 = log_configure_impl(local_d0[1],4,uVar5,uVar7,uVar8,uVar9);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(log_name_list[1].name, 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stderr))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x76,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  uVar5 = local_d0[3];
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar7 = log_policy_format_text();
  uVar8 = log_policy_schedule_sync();
  uVar9 = log_policy_storage_sequential();
  uVar10 = log_policy_stream_file(local_d0[3],"a+");
  uVar2 = log_configure_impl(uVar5,4,uVar7,uVar8,uVar9,uVar10);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(log_name_list[2].name, 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_file(log_name_list[2].name, \"a+\"))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x7c,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  uVar5 = local_a8;
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar7 = log_policy_format_text();
  uVar8 = log_policy_schedule_sync();
  uVar9 = log_policy_storage_sequential();
  uVar10 = log_policy_stream_syslog(local_a8);
  uVar2 = log_configure_impl(uVar5,4,uVar7,uVar8,uVar9,uVar10);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(log_name_list[3].name, 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_syslog(log_name_list[3].name))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x82,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar5 = log_policy_format_text();
  uVar7 = log_policy_schedule_sync();
  uVar8 = log_policy_storage_sequential();
  uVar9 = log_policy_stream_socket("127.0.0.1",0x208);
  uVar2 = log_configure_impl(local_98,4,uVar5,uVar7,uVar8,uVar9);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(log_name_list[4].name, 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_socket(\"127.0.0.1\", 0x0208))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x88,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar5 = log_policy_format_binary();
  uVar7 = log_policy_schedule_async();
  uVar8 = log_policy_storage_batch(0x10);
  uVar9 = log_policy_stream_stdio(_stdout);
  uVar2 = log_configure_impl(local_88,4,uVar5,uVar7,uVar8,uVar9);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(log_name_list[5].name, 4, log_policy_format_binary(), log_policy_schedule_async(), log_policy_storage_batch(storage_batch_size), log_policy_stream_stdio(stdout))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x8e,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar5 = log_policy_format_binary();
  uVar7 = log_policy_schedule_async();
  uVar8 = log_policy_storage_batch(0x10);
  uVar9 = log_policy_stream_stdio(_stderr);
  uVar2 = log_configure_impl(local_78,4,uVar5,uVar7,uVar8,uVar9);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(log_name_list[6].name, 4, log_policy_format_binary(), log_policy_schedule_async(), log_policy_storage_batch(storage_batch_size), log_policy_stream_stdio(stderr))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x94,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  uVar5 = local_68;
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar7 = log_policy_format_binary();
  uVar8 = log_policy_schedule_async();
  uVar9 = log_policy_storage_batch(0x10);
  uVar10 = log_policy_stream_file(local_68,"a+");
  uVar2 = log_configure_impl(uVar5,4,uVar7,uVar8,uVar9,uVar10);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(log_name_list[7].name, 4, log_policy_format_binary(), log_policy_schedule_async(), log_policy_storage_batch(storage_batch_size), log_policy_stream_file(log_name_list[7].name, \"a+\"))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x9a,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  uVar5 = local_58;
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar7 = log_policy_format_binary();
  uVar8 = log_policy_schedule_async();
  uVar9 = log_policy_storage_batch(0x10);
  uVar10 = log_policy_stream_syslog(local_58);
  uVar2 = log_configure_impl(uVar5,4,uVar7,uVar8,uVar9,uVar10);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(log_name_list[8].name, 4, log_policy_format_binary(), log_policy_schedule_async(), log_policy_storage_batch(storage_batch_size), log_policy_stream_syslog(log_name_list[8].name))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xa0,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar5 = log_policy_format_binary();
  uVar7 = log_policy_schedule_async();
  uVar8 = log_policy_storage_batch(0x10);
  uVar9 = log_policy_stream_socket("127.0.0.1",0x209);
  uVar2 = log_configure_impl(local_48,4,uVar5,uVar7,uVar8,uVar9);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(log_name_list[9].name, 4, log_policy_format_binary(), log_policy_schedule_async(), log_policy_storage_batch(storage_batch_size), log_policy_stream_socket(\"127.0.0.1\", 0x0209))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xa6,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  lVar13 = 0;
  do {
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar2 = log_write_impl_va(*(undefined8 *)((long)local_d0 + lVar13 + -8),0xaf,"TestBody",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                              ,1,"hello world");
    local_f8.data_._0_4_ = uVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_f0,"(int)0",
               "(int)log_write_impl_va(log_name_list[iterator].name, ((size_t)175), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world\")"
               ,(int *)&local_100,(int *)&local_f8);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if (local_e8 != (undefined8 *)0x0) {
        pcVar11 = (char *)*local_e8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xaf,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    puVar1 = local_e8;
    if (local_e8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_e8 != local_e8 + 2) {
        operator_delete((undefined8 *)*local_e8);
      }
      operator_delete(puVar1);
    }
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar2 = log_write_impl_va(*(undefined8 *)((long)local_d0 + lVar13 + -8),0xb0,"TestBody",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                              ,1,"hell yeah");
    local_f8.data_._0_4_ = uVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_f0,"(int)0",
               "(int)log_write_impl_va(log_name_list[iterator].name, ((size_t)176), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hell yeah\")"
               ,(int *)&local_100,(int *)&local_f8);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if (local_e8 != (undefined8 *)0x0) {
        pcVar11 = (char *)*local_e8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xb0,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    puVar1 = local_e8;
    if (local_e8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_e8 != local_e8 + 2) {
        operator_delete((undefined8 *)*local_e8);
      }
      operator_delete(puVar1);
    }
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0xa0);
  lVar12 = 1;
  lVar13 = 0;
  do {
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar2 = log_write_impl_va(local_d0[lVar13 + -1],0xba,"TestBody",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                              ,1,"hello world from log (id : %zu)",lVar12 + -1);
    local_f8.data_._0_4_ = uVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_f0,"(int)0",
               "(int)log_write_impl_va(log_name_list[iterator].name, ((size_t)186), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world from log (id : %\" \"z\" \"u\" \")\", iterator)"
               ,(int *)&local_100,(int *)&local_f8);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if (local_e8 != (undefined8 *)0x0) {
        pcVar11 = (char *)*local_e8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xba,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    puVar1 = local_e8;
    if (local_e8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_e8 != local_e8 + 2) {
        operator_delete((undefined8 *)*local_e8);
      }
      operator_delete(puVar1);
    }
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar2 = log_write_impl_va(0x40410300bcbe61d0,local_d0[lVar13 + -1],0xbb,"TestBody",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                              ,1,"%zu %f",lVar12);
    local_f8.data_._0_4_ = uVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_f0,"(int)0",
               "(int)log_write_impl_va(log_name_list[iterator].name, ((size_t)187), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"%\" \"z\" \"u\" \" %f\", iterator + 1, 34.02346)"
               ,(int *)&local_100,(int *)&local_f8);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if (local_e8 != (undefined8 *)0x0) {
        pcVar11 = (char *)*local_e8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xbb,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    puVar1 = local_e8;
    if (local_e8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_e8 != local_e8 + 2) {
        operator_delete((undefined8 *)*local_e8);
      }
      operator_delete(puVar1);
    }
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar2 = log_write_impl_va(local_d0[lVar13 + -1],0xbc,"TestBody",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                              ,1,"double log (id : %zu)",lVar13);
    local_f8.data_._0_4_ = uVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_f0,"(int)0",
               "(int)log_write_impl_va(log_name_list[iterator].name, ((size_t)188), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"double log (id : %\" \"z\" \"u\" \")\", iterator * 2)"
               ,(int *)&local_100,(int *)&local_f8);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if (local_e8 != (undefined8 *)0x0) {
        pcVar11 = (char *)*local_e8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xbc,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    puVar1 = local_e8;
    if (local_e8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_e8 != local_e8 + 2) {
        operator_delete((undefined8 *)*local_e8);
      }
      operator_delete(puVar1);
    }
    lVar12 = lVar12 + 1;
    lVar13 = lVar13 + 2;
  } while (lVar12 != 0xb);
  lVar13 = 0;
  do {
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar2 = log_clear(*(undefined8 *)((long)local_d0 + lVar13 + -8));
    local_f8.data_._0_4_ = uVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_f0,"(int)0","(int)log_clear(log_name_list[iterator].name)",(int *)&local_100,
               (int *)&local_f8);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if (local_e8 != (undefined8 *)0x0) {
        pcVar11 = (char *)*local_e8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xc6,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    puVar1 = local_e8;
    if (local_e8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_e8 != local_e8 + 2) {
        operator_delete((undefined8 *)*local_e8);
      }
      operator_delete(puVar1);
    }
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0xa0);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar5 = log_policy_format_text_flags(1);
  uVar7 = log_policy_schedule_sync();
  uVar8 = log_policy_storage_sequential();
  uVar9 = log_policy_stream_stdio(_stdout);
  uVar2 = log_configure_impl("newline",4,uVar5,uVar7,uVar8,uVar9);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(\"newline\", 4, log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_NEWLINE), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd0,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar2 = log_write_impl_va("newline",0xd2,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"NEW LINE A");
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_write_impl_va(\"newline\", ((size_t)210), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"NEW LINE A\")"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd2,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar2 = log_write_impl_va("newline",0xd3,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"NEW LINE B");
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_write_impl_va(\"newline\", ((size_t)211), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"NEW LINE B\")"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd3,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar2 = log_write_impl_va("newline",0xd4,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"hello world from log (id : %zu)",0x4d2);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_write_impl_va(\"newline\", ((size_t)212), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world from log (id : %\" \"z\" \"u\" \")\", 1234)"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd4,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar2 = log_write_impl_va("newline",0xd5,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"hello world from log (id : %zu)",0x1538);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_write_impl_va(\"newline\", ((size_t)213), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world from log (id : %\" \"z\" \"u\" \")\", 5432)"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd5,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar5 = log_policy_format_text_flags(0);
  uVar7 = log_policy_schedule_sync();
  uVar8 = log_policy_storage_sequential();
  uVar9 = log_policy_stream_stdio(_stdout);
  uVar2 = log_configure_impl("nonewline",4,uVar5,uVar7,uVar8,uVar9);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_configure_impl(\"nonewline\", 4, log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_EMPTY), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xdb,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar2 = log_write_impl_va("nonewline",0xdd,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"NO NEW LINE A");
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_write_impl_va(\"nonewline\", ((size_t)221), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"NO NEW LINE A\")"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xdd,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar2 = log_write_impl_va("nonewline",0xde,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"NO NEW LINE B");
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_write_impl_va(\"nonewline\", ((size_t)222), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"NO NEW LINE B\")"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xde,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar2 = log_write_impl_va("nonewline",0xdf,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"hello world from log (id : %zu)",0x4d2);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_write_impl_va(\"nonewline\", ((size_t)223), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world from log (id : %\" \"z\" \"u\" \")\", 1234)"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xdf,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar2 = log_write_impl_va("nonewline",0xe0,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"hello world from log (id : %zu)",0x1538);
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0",
             "(int)log_write_impl_va(\"nonewline\", ((size_t)224), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world from log (id : %\" \"z\" \"u\" \")\", 5432)"
             ,(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xe0,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar2 = log_clear("newline");
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0","(int)log_clear(\"newline\")",(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xe2,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  puVar1 = local_e8;
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(puVar1);
  }
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar2 = log_clear("nonewline");
  local_f8.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_f0,"(int)0","(int)log_clear(\"nonewline\")",(int *)&local_100,(int *)&local_f8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xe3,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(local_e8);
  }
  return;
}

Assistant:

TEST_F(log_test, DefaultConstructor)
{
	struct log_name_list_type
	{
		const char *name;
		unsigned int value;
	} log_name_list[] = {
		{ "test_log_text_sync_seq_stdout", 0 },
		{ "test_log_text_sync_seq_stderr", 1 },
		{ "test_log_text_sync_seq_file", 2 },
		{ "test_log_text_sync_seq_syslog", 3 },
		{ "test_log_text_sync_seq_socket", 4 },
		{ "test_log_bin_async_bat_stdout", 5 },
		{ "test_log_bin_async_bat_stderr", 6 },
		{ "test_log_bin_async_bat_file", 7 },
		{ "test_log_bin_async_bat_syslog", 8 },
		{ "test_log_bin_async_bat_socket", 9 }
	};

	const size_t log_name_list_size = sizeof(log_name_list) / sizeof(log_name_list[0]);

	/* Log map */
	{
		size_t iterator;

		log_map_iterator map_iterator;

		log_map map = log_map_create((size_t)0x00000200);

		EXPECT_NE((log_map)NULL, (log_map)map);

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_map_insert(map, log_name_list[iterator].name, (const void *)&log_name_list[iterator].value));
		}

		EXPECT_EQ((size_t)log_name_list_size, (size_t)log_map_size(map));

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			const void *value_ptr = log_map_get(map, log_name_list[iterator].name);

			unsigned int value = *((unsigned int *)value_ptr);

			EXPECT_EQ((unsigned int)log_name_list[iterator].value, (unsigned int)value);
		}

		for (map_iterator = log_map_iterator_begin(map); log_map_iterator_end(map_iterator) != 0; log_map_iterator_next(map_iterator))
		{
			const char *key = log_map_iterator_key(map_iterator);

			const void *value_ptr = log_map_iterator_value(map_iterator);

			unsigned int value = *((unsigned int *)value_ptr);

			EXPECT_EQ((int)0, (int)strcmp(log_name_list[value].name, key));
		}

		EXPECT_EQ((int)log_map_destroy(map), (int)0);
	}

	/* Create logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_create(log_name_list[iterator].name));
		}
	}

	/* Set policies */
	{
		const size_t storage_batch_size = ((size_t)0x00000010);

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[0].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[1].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stderr)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[2].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_file(log_name_list[2].name, "a+")));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[3].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_syslog(log_name_list[3].name)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[4].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_socket("127.0.0.1", UINT16_C(0x0208))));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[5].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[6].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_stdio(stderr)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[7].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_file(log_name_list[7].name, "a+")));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[8].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_syslog(log_name_list[8].name)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[9].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_socket("127.0.0.1", UINT16_C(0x0209))));
	}

	/* Write simple logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "hello world"));
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "hell yeah"));
		}
	}

	/* Write varidic logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", iterator));
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "%" PRIuS " %f", iterator + 1, 34.02346));
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "double log (id : %" PRIuS ")", iterator * 2));
		}
	}

	/* Clear all logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_clear(log_name_list[iterator].name));
		}
	}

	/* Policy format text flags */
	{
		EXPECT_EQ((int)0, (int)log_configure("newline",
							  log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_NEWLINE),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "NEW LINE A"));
		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "NEW LINE B"));
		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 1234));
		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 5432));

		EXPECT_EQ((int)0, (int)log_configure("nonewline",
							  log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_EMPTY),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "NO NEW LINE A"));
		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "NO NEW LINE B"));
		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 1234));
		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 5432));

		EXPECT_EQ((int)0, (int)log_clear("newline"));
		EXPECT_EQ((int)0, (int)log_clear("nonewline"));
	}
}